

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteredStorage.hpp
# Opt level: O0

optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> * __thiscall
supermap::
FilteredStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_supermap::Key<2UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
::find(FilteredStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_supermap::Key<2UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
       *this,Key<2UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
            *equal)

{
  uint uVar1;
  element_type *peVar2;
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
  *in_RDX;
  optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> *in_RDI;
  shared_ptr<supermap::Filter<supermap::Key<2UL>_>_> filter;
  shared_ptr<supermap::Filter<supermap::Key<2UL>_>_> *in_stack_ffffffffffffff08;
  shared_ptr<supermap::Filter<supermap::Key<2UL>_>_> *in_stack_ffffffffffffff10;
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
  *this_00;
  OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff88;
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
  *in_stack_ffffffffffffff90;
  Key<2UL> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
  ::getRegisterInfo(in_stack_ffffffffffffff18);
  std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>::shared_ptr
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>::
  ~CountingStorageInfo
            ((CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>
              *)0x19b98e);
  peVar2 = std::
           __shared_ptr_access<supermap::Filter<supermap::Key<2UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<supermap::Filter<supermap::Key<2UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x19b998);
  uVar1 = (*(peVar2->super_Cloneable<supermap::Filter<supermap::Key<2UL>_>_>)._vptr_Cloneable[4])
                    (peVar2,in_RDX);
  if ((uVar1 & 1) == 0) {
    std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>::optional(in_RDI);
  }
  else {
    this_00 = (function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
               *)&stack0xffffffffffffff80;
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
    ::function(this_00,in_RDX);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
    ::function(this_00,in_RDX);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
    ::find((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>
            *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
           (function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
            *)in_stack_ffffffffffffff88);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
                 *)0x19ba4c);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
                 *)0x19ba56);
  }
  std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>::~shared_ptr
            ((shared_ptr<supermap::Filter<supermap::Key<2UL>_>_> *)0x19ba9a);
  return in_RDI;
}

Assistant:

std::optional<Content> find(
        const FindPattern &pattern,
        std::function<bool(const Content &, const FindPattern &)> less,
        std::function<bool(const Content &, const FindPattern &)> equal
    ) override {
        std::shared_ptr<FilterBase> filter = this->getRegisterInfo().additional;
        if (!filter->mightContain(pattern)) {
            return std::nullopt;
        }
        return SortedStorage::find(pattern, std::move(less), std::move(equal));
    }